

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O1

void __thiscall
sjtu::OrderManager::buy_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  string *psVar1;
  pointer pcVar2;
  char *pcVar3;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_00;
  UserManager *this_01;
  bool bVar4;
  int iVar5;
  int *piVar6;
  orderType *order;
  long *plVar7;
  size_t sVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  string *psVar12;
  long lVar13;
  string *psVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  string uname;
  string uto;
  string ufrom;
  string utrain;
  timeType uday;
  char *local_158;
  char *local_150;
  long local_148;
  char local_140;
  undefined7 uStack_13f;
  char *local_130;
  undefined8 local_128;
  char local_120;
  undefined7 uStack_11f;
  char *local_110;
  undefined8 local_108;
  char local_100;
  undefined7 uStack_ff;
  char *local_f0;
  undefined8 local_e8;
  char local_e0;
  undefined7 uStack_df;
  TrainManager *local_d0;
  UserManager *local_c8;
  string *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  value_type local_60;
  char *local_48;
  undefined8 uStack_40;
  
  local_150 = &local_140;
  iVar15 = 0;
  iVar5 = 0;
  local_148 = 0;
  local_140 = '\0';
  local_f0 = &local_e0;
  local_e8 = 0;
  local_e0 = '\0';
  local_110 = &local_100;
  local_108 = 0;
  local_100 = '\0';
  local_158 = &local_120;
  local_128 = 0;
  local_120 = '\0';
  local_48 = (char *)0x0;
  uStack_40 = 0;
  local_130 = local_158;
  local_d0 = train_manager;
  local_c8 = user_manager;
  if (argc < 1) {
    bVar17 = true;
  }
  else {
    psVar14 = argv + 1;
    bVar17 = false;
    do {
      psVar1 = psVar14 + -1;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      psVar12 = (string *)&local_150;
      if (iVar5 == 0) {
LAB_0010983a:
        std::__cxx11::string::_M_assign(psVar12);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        psVar12 = (string *)&local_f0;
        if (iVar5 == 0) goto LAB_0010983a;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar5 == 0) {
          pcVar2 = (psVar14->_M_dataplus)._M_p;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,pcVar2,pcVar2 + psVar14->_M_string_length);
          timeType::timeType((timeType *)&local_60,&local_80);
          local_48 = (char *)local_60.first.first;
          uStack_40 = CONCAT44(local_60.first._12_4_,local_60.first.second);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)psVar1);
            psVar12 = (string *)&local_110;
            if (iVar5 != 0) {
              iVar5 = std::__cxx11::string::compare((char *)psVar1);
              psVar12 = (string *)&local_130;
              if (iVar5 != 0) {
                iVar5 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar5 == 0) {
                  iVar5 = std::__cxx11::string::compare((char *)psVar14);
                  bVar17 = iVar5 == 0;
                }
                goto LAB_00109842;
              }
            }
            goto LAB_0010983a;
          }
          pcVar3 = (psVar14->_M_dataplus)._M_p;
          piVar6 = __errno_location();
          iVar5 = *piVar6;
          *piVar6 = 0;
          local_158 = (char *)strtol(pcVar3,(char **)&local_60,10);
          if ((char *)local_60.first.first == pcVar3) {
LAB_00109d43:
            uVar9 = std::__throw_invalid_argument("stoi");
            if (local_c0 != &local_80) {
              operator_delete(local_c0,(ulong)(local_b0._0_8_ + 1));
            }
            if (local_130 != &local_120) {
              operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
            }
            if (local_110 != &local_100) {
              operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
            }
            if (local_f0 != &local_e0) {
              operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
            }
            if (local_150 != &local_140) {
              operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
            }
            _Unwind_Resume(uVar9);
          }
          if (((char *)(long)(int)local_158 != local_158) || (*piVar6 == 0x22)) {
            std::__throw_out_of_range("stoi");
            goto LAB_00109d43;
          }
          if (*piVar6 == 0) {
            *piVar6 = iVar5;
          }
        }
      }
LAB_00109842:
      psVar14 = psVar14 + 2;
      iVar15 = iVar15 + 2;
    } while (iVar15 < argc);
    iVar5 = (int)local_158;
    bVar17 = !bVar17;
  }
  local_a0._M_allocated_capacity = (size_type)&local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_b0 + 0x10),local_150,local_150 + local_148);
  this_01 = local_c8;
  bVar4 = UserManager::is_login(local_c8,(string *)(local_b0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_allocated_capacity != &local_90) {
    operator_delete((void *)local_a0._M_allocated_capacity,local_90._M_allocated_capacity + 1);
  }
  if (bVar4) {
    order = (orderType *)operator_new(0xb8);
    order->date[1].month = 0;
    order->date[1].day = 0;
    order->date[1].hour = 0;
    order->date[1].minute = 0;
    order->date[0].month = 0;
    order->date[0].day = 0;
    order->date[0].hour = 0;
    order->date[0].minute = 0;
    strcpy((char *)order,local_150);
    pcVar3 = order->trainID;
    strcpy(pcVar3,local_f0);
    strcpy(order->station[0],local_110);
    strcpy(order->station[1],local_130);
    order->num = iVar5;
    *(char **)order->date = local_48;
    order->date[0].hour = (undefined4)uStack_40;
    order->date[0].minute = uStack_40._4_4_;
    bVar4 = TrainManager::buy_ticket(local_d0,order);
    if (bVar4) {
      if (order->status == success) {
        UserManager::add_order(this_01,this,order);
        plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,order->num * order->price);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      }
      else if (bVar17) {
        plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      }
      else {
        order->status = pending;
        UserManager::add_order(this_01,this,order);
        this_00 = this->PendingBpTree;
        local_c0 = (string *)local_b0;
        sVar8 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar3,pcVar3 + sVar8);
        if (local_b8 == 0) {
          local_60.first.first = 0;
        }
        else {
          lVar13 = 0;
          lVar10 = 0;
          uVar11 = 0;
          do {
            uVar16 = (ulong)((int)*(char *)((long)&(local_c0->_M_dataplus)._M_p + lVar13) + 0x100);
            lVar10 = (long)(lVar10 * 0x239 + uVar16) % 0x3b800001;
            uVar11 = (long)(uVar11 * 0x301 + uVar16) % 0x3b9aca07;
            lVar13 = lVar13 + 1;
          } while (local_b8 != lVar13);
          local_60.first.first = lVar10 << 0x20 | uVar11;
        }
        local_60.first.second = this->pending_id + 1;
        this->pending_id = local_60.first.second;
        local_60.second = order->offset;
        BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        ::insert(this_00,&local_60);
        if (local_c0 != (string *)local_b0) {
          operator_delete(local_c0,(ulong)(local_b0._0_8_ + 1));
        }
        plVar7 = &std::cout;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"queue",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      }
    }
    else {
      plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    }
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    operator_delete(order,0xb8);
  }
  else {
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  return;
}

Assistant:

void buy_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname, utrain, ufrom, uto;timeType uday;
            int unum;
            bool ifpending = false;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-i") utrain = argv[i + 1];
                else if (argv[i] == "-d") uday = timeType(argv[i + 1]);
                else if (argv[i] == "-n") unum = stoi(argv[i + 1]);
                else if (argv[i] == "-f") ufrom = argv[i + 1];
                else if (argv[i] == "-t") uto = argv[i + 1];
                else if (argv[i] == "-q") {
                    if (argv[i + 1] == "true") ifpending = true;
                    else ifpending = false;
                }
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                strcpy(tmp->trainID, utrain.c_str());
                strcpy(tmp->station[0], ufrom.c_str());
                strcpy(tmp->station[1], uto.c_str());
                tmp -> num = unum;
                tmp->date[0] = uday;
                if (train_manager->buy_ticket(tmp) == false) std::cout << -1 << std::endl;
                else {
                    if (tmp->status == success) {
                        user_manager->add_order(this, tmp);
                        std::cout << tmp->price * tmp->num << std::endl;
                    }
                    else {
                        if (ifpending == false) std::cout << -1 << std::endl;
                        else {
                            tmp->status = pending;
                            user_manager->add_order(this, tmp);
                            PendingBpTree->insert(std::make_pair(std::make_pair(hasher(tmp->trainID), ++ pending_id), tmp->offset));
                            std::cout << "queue" << std::endl;
                        }
                    }
                }
                delete tmp;
            }
        }